

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithimetrics.cpp
# Opt level: O1

void __thiscall ithimetrics::ithimetrics(ithimetrics *this)

{
  ComputeM1::ComputeM1(&this->cm1);
  ComputeM2::ComputeM2(&this->cm2);
  ComputeM3::ComputeM3(&this->cm3);
  ComputeM4::ComputeM4(&this->cm4);
  ComputeM6::ComputeM6(&this->cm6);
  ComputeM7::ComputeM7(&this->cm7);
  ComputeM8::ComputeM8(&this->cm8);
  this->metric_file[10] = (char *)0x0;
  this->metric_is_available[0] = false;
  this->metric_is_available[1] = false;
  this->metric_is_available[2] = false;
  this->metric_is_available[3] = false;
  this->metric_is_available[4] = false;
  this->metric_is_available[5] = false;
  this->metric_is_available[6] = false;
  this->metric_is_available[7] = false;
  this->metric_file[8] = (char *)0x0;
  this->metric_file[9] = (char *)0x0;
  this->metric_file[6] = (char *)0x0;
  this->metric_file[7] = (char *)0x0;
  this->metric_file[4] = (char *)0x0;
  this->metric_file[5] = (char *)0x0;
  this->metric_file[2] = (char *)0x0;
  this->metric_file[3] = (char *)0x0;
  this->metric_file[0] = (char *)0x0;
  this->metric_file[1] = (char *)0x0;
  this->metric_date = (char *)0x0;
  this->ithi_folder = (char *)0x0;
  this->metric_is_available[7] = false;
  this->metric_is_available[8] = false;
  this->metric_is_available[9] = false;
  this->metric_is_available[10] = false;
  this->compliance_file_name = (char *)0x0;
  this->root_capture_file_name = (char *)0x0;
  this->recursive_capture_file_name = (char *)0x0;
  this->authoritative_capture_file_name = (char *)0x0;
  this->abuse_file_name_tlds = (char *)0x0;
  this->abuse_file_name_registrars = (char *)0x0;
  this->root_zone_file_name = (char *)0x0;
  return;
}

Assistant:

ithimetrics::ithimetrics()
    :
    metric_date(NULL),
    ithi_folder(NULL),
    compliance_file_name(NULL),
    root_capture_file_name(NULL),
    recursive_capture_file_name(NULL),
    authoritative_capture_file_name(NULL),
    abuse_file_name_tlds(NULL),
    abuse_file_name_registrars(NULL),
    root_zone_file_name(NULL)
{
    for (int i = 0; i < ITHI_NUMBER_OF_METRICS; i++) {
        metric_file[i] = NULL;
        metric_is_available[i] = false;
    }
}